

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O1

void __thiscall
CVmObjIterIdx::load_from_image(CVmObjIterIdx *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  uint *puVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  
  if ((this->super_CVmObjIter).super_CVmObject.ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
    (this->super_CVmObjIter).super_CVmObject.ext_ = (char *)0x0;
  }
  sVar3 = 0x15;
  if (0x15 < siz) {
    sVar3 = siz;
  }
  iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,sVar3,this);
  (this->super_CVmObjIter).super_CVmObject.ext_ = (char *)CONCAT44(extraout_var,iVar2);
  memcpy((char *)CONCAT44(extraout_var,iVar2),ptr,siz);
  puVar1 = (uint *)((this->super_CVmObjIter).super_CVmObject.ext_ + 0x11);
  *puVar1 = *puVar1 & 0xfffffffe;
  CVmObjTable::save_image_pointer(&G_obj_table_X,self,ptr,siz);
  return;
}

Assistant:

void CVmObjIterIdx::load_from_image(VMG_ vm_obj_id_t self,
                                    const char *ptr, size_t siz)
{
    /* if we already have memory allocated, free it */
    if (ext_ != 0)
    {
        G_mem->get_var_heap()->free_mem(ext_);
        ext_ = 0;
    }

    /* 
     *   Allocate a new extension.  Make sure it's at least as large as
     *   the current standard extension size.  
     */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(siz < VMOBJITERIDX_EXT_SIZE
                       ? VMOBJITERIDX_EXT_SIZE : siz, this);

    /* copy the image data to our extension */
    memcpy(ext_, ptr, siz);

    /* clear the undo flag */
    set_flags(get_flags() & ~VMOBJITERIDX_UNDO);

    /* save our image data pointer, so we can use it for reloading */
    G_obj_table->save_image_pointer(self, ptr, siz);
}